

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O0

void number_suite::run(void)

{
  test_float_zero();
  test_double_zero();
  test_unsigned_double_zero();
  test_double_one();
  test_double_minus_one();
  test_double_half();
  test_double_minus_half();
  test_double_e_100();
  test_double_e_minus_100();
  test_float_max();
  test_double_max();
  test_float_min();
  test_double_min();
  test_float_infinity();
  test_double_infinity();
  test_float_minus_infinity();
  test_double_minus_infinity();
  test_float_nan();
  test_double_nan();
  return;
}

Assistant:

void run()
{
    test_float_zero();
    test_double_zero();
    test_unsigned_double_zero();
    test_double_one();
    test_double_minus_one();
    test_double_half();
    test_double_minus_half();
    test_double_e_100();
    test_double_e_minus_100();
    test_float_max();
    test_double_max();
    test_float_min();
    test_double_min();
    test_float_infinity();
    test_double_infinity();
    test_float_minus_infinity();
    test_double_minus_infinity();
    test_float_nan();
    test_double_nan();
}